

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O0

void random_cb(uv_random_t *req,int status,void *buf,size_t buflen)

{
  int iVar1;
  undefined1 local_128 [8];
  char zero [256];
  size_t buflen_local;
  void *buf_local;
  int status_local;
  uv_random_t *req_local;
  
  zero._248_8_ = buflen;
  memset(local_128,0,0x100);
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x24,"0 == status");
    abort();
  }
  if ((char *)buf != scratch) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x25,"buf == (void*) scratch");
    abort();
  }
  if (random_cb_called == 0) {
    if (zero._248_8_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
              ,0x28,"buflen == 0");
      abort();
    }
    iVar1 = memcmp(scratch,local_128,0x100);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
              ,0x29,"0 == memcmp(scratch, zero, sizeof(zero))");
      abort();
    }
  }
  else {
    if (zero._248_8_ != 0x100) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
              ,0x2b,"buflen == sizeof(scratch)");
      abort();
    }
    iVar1 = memcmp(scratch,local_128,0x100);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
              ,0x2d,"0 != memcmp(scratch, zero, sizeof(zero))");
      abort();
    }
  }
  random_cb_called = random_cb_called + 1;
  return;
}

Assistant:

static void random_cb(uv_random_t* req, int status, void* buf, size_t buflen) {
  char zero[sizeof(scratch)];

  memset(zero, 0, sizeof(zero));

  ASSERT(0 == status);
  ASSERT(buf == (void*) scratch);

  if (random_cb_called == 0) {
    ASSERT(buflen == 0);
    ASSERT(0 == memcmp(scratch, zero, sizeof(zero)));
  } else {
    ASSERT(buflen == sizeof(scratch));
    /* Buy a lottery ticket if you manage to trip this assertion. */
    ASSERT(0 != memcmp(scratch, zero, sizeof(zero)));
  }

  random_cb_called++;
}